

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O0

void resp0_pipe_fini(void *arg)

{
  nni_msg *m;
  nng_msg *msg;
  resp0_pipe *p;
  void *arg_local;
  
  m = nni_aio_get_msg((nni_aio *)((long)arg + 0x1f8));
  if (m != (nni_msg *)0x0) {
    nni_aio_set_msg((nni_aio *)((long)arg + 0x1f8),(nni_msg *)0x0);
    nni_msg_free(m);
  }
  nni_aio_fini((nni_aio *)((long)arg + 0x30));
  nni_aio_fini((nni_aio *)((long)arg + 0x1f8));
  return;
}

Assistant:

static void
resp0_pipe_fini(void *arg)
{
	resp0_pipe *p = arg;
	nng_msg    *msg;

	if ((msg = nni_aio_get_msg(&p->aio_recv)) != NULL) {
		nni_aio_set_msg(&p->aio_recv, NULL);
		nni_msg_free(msg);
	}
	nni_aio_fini(&p->aio_send);
	nni_aio_fini(&p->aio_recv);
}